

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

int jpeg_huff_decode(bitread_working_state *state,bit_buf_type get_buffer,int bits_left,
                    d_derived_tbl *htbl,int min_bits)

{
  boolean bVar1;
  ulong local_40;
  INT32 code;
  int l;
  int min_bits_local;
  d_derived_tbl *htbl_local;
  bit_buf_type bStack_20;
  int bits_left_local;
  bit_buf_type get_buffer_local;
  bitread_working_state *state_local;
  
  htbl_local._4_4_ = bits_left;
  bStack_20 = get_buffer;
  if (bits_left < min_bits) {
    bVar1 = jpeg_fill_bit_buffer(state,get_buffer,bits_left,min_bits);
    if (bVar1 == 0) {
      return -1;
    }
    bStack_20 = state->get_buffer;
    htbl_local._4_4_ = state->bits_left;
  }
  htbl_local._4_4_ = htbl_local._4_4_ - min_bits;
  local_40 = (ulong)(int)((uint)(bStack_20 >> ((byte)htbl_local._4_4_ & 0x3f)) & bmask[min_bits]);
  code._0_4_ = min_bits;
  do {
    if ((long)local_40 <= htbl->maxcode[(int)code]) {
      state->get_buffer = bStack_20;
      state->bits_left = htbl_local._4_4_;
      if ((int)code < 0x11) {
        state_local._4_4_ =
             (uint)htbl->pub->huffval[(int)local_40 + (int)htbl->valoffset[(int)code]];
      }
      else {
        state->cinfo->err->msg_code = 0x79;
        (*state->cinfo->err->emit_message)((j_common_ptr)state->cinfo,-1);
        state_local._4_4_ = 0;
      }
      return state_local._4_4_;
    }
    if (htbl_local._4_4_ < 1) {
      bVar1 = jpeg_fill_bit_buffer(state,bStack_20,htbl_local._4_4_,1);
      if (bVar1 == 0) {
        return -1;
      }
      bStack_20 = state->get_buffer;
      htbl_local._4_4_ = state->bits_left;
    }
    htbl_local._4_4_ = htbl_local._4_4_ + -1;
    local_40 = (long)(int)((uint)(bStack_20 >> ((byte)htbl_local._4_4_ & 0x3f)) & 1) | local_40 << 1
    ;
    code._0_4_ = (int)code + 1;
  } while( true );
}

Assistant:

LOCAL(int)
jpeg_huff_decode (bitread_working_state * state,
		  register bit_buf_type get_buffer, register int bits_left,
		  d_derived_tbl * htbl, int min_bits)
{
  register int l = min_bits;
  register INT32 code;

  /* HUFF_DECODE has determined that the code is at least min_bits */
  /* bits long, so fetch that many bits in one swoop. */

  CHECK_BIT_BUFFER(*state, l, return -1);
  code = GET_BITS(l);

  /* Collect the rest of the Huffman code one bit at a time. */
  /* This is per Figure F.16 in the JPEG spec. */

  while (code > htbl->maxcode[l]) {
    code <<= 1;
    CHECK_BIT_BUFFER(*state, 1, return -1);
    code |= GET_BITS(1);
    l++;
  }

  /* Unload the local registers */
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  /* With garbage input we may reach the sentinel value l = 17. */

  if (l > 16) {
    WARNMS(state->cinfo, JWRN_HUFF_BAD_CODE);
    return 0;			/* fake a zero as the safest result */
  }

  return htbl->pub->huffval[ (int) (code + htbl->valoffset[l]) ];
}